

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::base::utils::CommandLineArgs::setArgs(CommandLineArgs *this,int argc,char **argv)

{
  char *__s;
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  _Alloc_hider _Var5;
  long lVar6;
  string key;
  uint *local_c0;
  undefined8 local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  uint *local_80;
  undefined8 local_78;
  uint local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_60;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_60 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_params;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_60);
  local_58 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->m_paramsWithValue;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)local_58);
  if (argv != (char **)0x0 && argc != 0) {
    this->m_argc = argc;
    this->m_argv = argv;
    if (1 < argc) {
      lVar6 = 1;
      do {
        __s = this->m_argv[lVar6];
        pcVar2 = strchr(__s,0x3d);
        if (pcVar2 == (char *)0x0) {
          bVar1 = hasParam(this,__s);
          if (!bVar1) {
            ::std::__cxx11::string::string
                      ((string *)&local_a0,this->m_argv[lVar6],(allocator *)&local_50);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_60,&local_a0);
            paVar4 = &local_a0.field_2;
            _Var5._M_p = local_a0._M_dataplus._M_p;
            goto LAB_0016253d;
          }
        }
        else if (*pcVar2 != '\0') {
          ::std::__cxx11::string::string((string *)&local_50,__s,(allocator *)&local_a0);
          ::std::__cxx11::string::find((char)(string *)&local_50,0x3d);
          ::std::__cxx11::string::substr((ulong)&local_a0,(ulong)&local_50);
          ::std::__cxx11::string::operator=((string *)&local_50,(string *)&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          bVar1 = hasParamWithValue(this,local_50->_M_local_buf);
          if (!bVar1) {
            local_c0 = &local_b0;
            sVar3 = strlen(pcVar2 + 1);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c0,pcVar2 + 1,pcVar2 + sVar3 + 1);
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_a0,local_50,local_50->_M_local_buf + local_48);
            local_80 = &local_70;
            if (local_c0 == &local_b0) {
              uStack_68 = uStack_a8;
              uStack_64 = uStack_a4;
            }
            else {
              local_80 = local_c0;
            }
            _local_70 = CONCAT44(uStack_ac,local_b0);
            local_78 = local_b8;
            local_b8 = 0;
            local_b0 = local_b0 & 0xffffff00;
            local_c0 = &local_b0;
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string,std::__cxx11::string>>(local_58,&local_a0);
            if (local_80 != &local_70) {
              operator_delete(local_80);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p);
            }
            if (local_c0 != &local_b0) {
              operator_delete(local_c0);
            }
          }
          paVar4 = &local_40;
          _Var5._M_p = (pointer)local_50;
LAB_0016253d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var5._M_p != paVar4) {
            operator_delete(_Var5._M_p);
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < this->m_argc);
    }
  }
  return;
}

Assistant:

void CommandLineArgs::setArgs(int argc, char** argv) {
  m_params.clear();
  m_paramsWithValue.clear();
  if (argc == 0 || argv == nullptr) {
    return;
  }
  m_argc = argc;
  m_argv = argv;
  for (int i = 1; i < m_argc; ++i) {
    const char* v = (strstr(m_argv[i], "="));
    if (v != nullptr && strlen(v) > 0) {
      std::string key = std::string(m_argv[i]);
      key = key.substr(0, key.find_first_of('='));
      if (hasParamWithValue(key.c_str())) {
        ELPP_INTERNAL_INFO(1, "Skipping [" << key << "] arg since it already has value ["
                           << getParamValue(key.c_str()) << "]");
      } else {
        m_paramsWithValue.insert(std::make_pair(key, std::string(v + 1)));
      }
    }
    if (v == nullptr) {
      if (hasParam(m_argv[i])) {
        ELPP_INTERNAL_INFO(1, "Skipping [" << m_argv[i] << "] arg since it already exists");
      } else {
        m_params.push_back(std::string(m_argv[i]));
      }
    }
  }
}